

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O0

results_type * __thiscall
webfront::http::std::experimental::net::v1::ip::basic_resolver<std::experimental::net::v1::ip::tcp>
::resolve(basic_resolver<std::experimental::net::v1::ip::tcp> *this,string_view host,
         string_view service,flags resolve_flags)

{
  service_type *this_00;
  implementation_type *location;
  basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
  *in_RSI;
  results_type *in_RDI;
  resolver_service<std::experimental::net::v1::ip::tcp> *in_R8;
  basic_resolver_query<std::experimental::net::v1::ip::tcp> q;
  error_code ec;
  results_type *r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  allocator<char> in_stack_fffffffffffffef7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  flags in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  basic_resolver_query<std::experimental::net::v1::ip::tcp> *in_stack_ffffffffffffff30;
  error_code *in_stack_ffffffffffffffc0;
  query_type *in_stack_ffffffffffffffc8;
  basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
  *pbVar1;
  
  pbVar1 = in_RSI;
  error_code::error_code((error_code *)in_stack_fffffffffffffec0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)));
  basic_resolver_query<std::experimental::net::v1::ip::tcp>::basic_resolver_query
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffec0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffec0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  this_00 = basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
            ::get_service(in_RSI);
  location = basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
             ::get_implementation(in_RSI);
  v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>::resolve
            (in_R8,(implementation_type *)pbVar1,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
            );
  v1::detail::throw_error((error_code *)this_00,(char *)location);
  basic_resolver_query<std::experimental::net::v1::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<std::experimental::net::v1::ip::tcp> *)this_00);
  return in_RDI;
}

Assistant:

results_type resolve(NET_TS_STRING_VIEW_PARAM host,
      NET_TS_STRING_VIEW_PARAM service, resolver_base::flags resolve_flags)
  {
    std::error_code ec;
    basic_resolver_query<protocol_type> q(static_cast<std::string>(host),
        static_cast<std::string>(service), resolve_flags);
    results_type r = this->get_service().resolve(
        this->get_implementation(), q, ec);
    std::experimental::net::v1::detail::throw_error(ec, "resolve");
    return r;
  }